

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

spv_result_t
spvtools::val::ValidateStructuredSelections
          (ValidationState_t *_,
          vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
          *postorder)

{
  bool bVar1;
  Op OVar2;
  reference ppBVar3;
  Instruction *pIVar4;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *pvVar5;
  const_reference pvVar6;
  DiagnosticStream *pDVar7;
  ulong uVar8;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  size_type sVar9;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar10;
  uint local_4e8;
  uint local_4e4;
  uint target;
  uint32_t i;
  undefined4 local_304;
  DiagnosticStream local_300;
  _Node_iterator_base<unsigned_int,_false> local_128;
  byte local_120;
  _Node_iterator_base<unsigned_int,_false> local_118;
  byte local_110;
  byte local_101;
  _Node_iterator_base<unsigned_int,_false> _Stack_100;
  bool false_label_unseen;
  byte local_f8;
  _Node_iterator_base<unsigned_int,_false> local_f0;
  byte local_e8;
  byte local_d9;
  uint local_d8;
  uint uStack_d4;
  bool true_label_unseen;
  uint false_label;
  uint true_label;
  undefined1 local_c8;
  uint local_bc;
  _Node_iterator_base<unsigned_int,_false> local_b8;
  undefined1 local_b0;
  uint local_a4;
  _Node_iterator_base<unsigned_int,_false> local_a0;
  undefined1 local_98;
  uint local_8c;
  Instruction *local_88;
  value_type *merge;
  long index;
  Instruction *terminator;
  BasicBlock *block;
  undefined1 local_60 [8];
  const_reverse_iterator iter;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen;
  vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  *postorder_local;
  ValidationState_t *__local;
  
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&iter);
  std::vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  ::rbegin((vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
            *)local_60);
  do {
    std::
    vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>::
    rend((vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
          *)&block);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::val::BasicBlock_*const_*,_std::vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>_>_>
                             *)local_60,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::val::BasicBlock_*const_*,_std::vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>_>_>
                             *)&block);
    if (!bVar1) {
      __local._4_4_ = SPV_SUCCESS;
LAB_0051822c:
      local_304 = 1;
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&iter);
      return __local._4_4_;
    }
    ppBVar3 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::val::BasicBlock_*const_*,_std::vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::val::BasicBlock_*const_*,_std::vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>_>_>
                           *)local_60);
    terminator = (Instruction *)*ppBVar3;
    pIVar4 = BasicBlock::terminator((BasicBlock *)terminator);
    index = (long)pIVar4;
    if (pIVar4 != (Instruction *)0x0) {
      pvVar5 = ValidationState_t::ordered_instructions(_);
      pvVar6 = std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
               ::operator[](pvVar5,0);
      merge = (value_type *)(((long)pIVar4 - (long)pvVar6) / 0x88);
      pvVar5 = ValidationState_t::ordered_instructions(_);
      local_88 = std::
                 vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
                 operator[](pvVar5,(size_type)
                                   ((long)&merge[-1].uses_.
                                           super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      OVar2 = Instruction::opcode(local_88);
      if (OVar2 == OpSelectionMerge) {
        local_8c = Instruction::GetOperandAs<unsigned_int>(local_88,0);
        pVar10 = std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&iter,&local_8c);
        local_a0._M_cur =
             (__node_type *)pVar10.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_98 = pVar10.second;
      }
      else {
        OVar2 = Instruction::opcode(local_88);
        if (OVar2 == OpLoopMerge) {
          local_a4 = Instruction::GetOperandAs<unsigned_int>(local_88,0);
          pVar10 = std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&iter,&local_a4);
          local_b8._M_cur =
               (__node_type *)pVar10.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
          local_b0 = pVar10.second;
          local_bc = Instruction::GetOperandAs<unsigned_int>(local_88,1);
          pVar10 = std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&iter,&local_bc);
          _false_label = (__node_type *)
                         pVar10.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
          local_c8 = pVar10.second;
        }
        else {
          local_88 = (Instruction *)0x0;
        }
      }
      bVar1 = BasicBlock::structurally_reachable((BasicBlock *)terminator);
      if (bVar1) {
        OVar2 = Instruction::opcode((Instruction *)index);
        if (OVar2 == OpBranchConditional) {
          uStack_d4 = Instruction::GetOperandAs<unsigned_int>((Instruction *)index,1);
          local_d8 = Instruction::GetOperandAs<unsigned_int>((Instruction *)index,2);
          pVar10 = std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&iter,&stack0xffffffffffffff2c);
          _Stack_100._M_cur =
               (__node_type *)pVar10.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
          local_f8 = pVar10.second;
          local_d9 = local_f8 & 1;
          local_f0._M_cur = _Stack_100._M_cur;
          local_e8 = local_f8;
          pVar10 = std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&iter,&local_d8);
          local_128._M_cur =
               (__node_type *)pVar10.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
          local_120 = pVar10.second;
          local_101 = local_120 & 1;
          local_118._M_cur = local_128._M_cur;
          local_110 = local_120;
          if ((((local_88 == (Instruction *)0x0) ||
               (OVar2 = Instruction::opcode(local_88), OVar2 == OpLoopMerge)) &&
              ((local_d9 & 1) != 0)) && ((local_101 & 1) != 0)) {
            ValidationState_t::diag(&local_300,_,SPV_ERROR_INVALID_CFG,(Instruction *)index);
            pDVar7 = DiagnosticStream::operator<<
                               (&local_300,(char (*) [29])"Selection must be structured");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
            DiagnosticStream::~DiagnosticStream(&local_300);
            goto LAB_0051822c;
          }
        }
        else {
          OVar2 = Instruction::opcode((Instruction *)index);
          if (OVar2 == OpSwitch) {
            if (local_88 == (Instruction *)0x0) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&target,_,SPV_ERROR_INVALID_CFG,(Instruction *)index);
              pDVar7 = DiagnosticStream::operator<<
                                 ((DiagnosticStream *)&target,
                                  (char (*) [61])
                                  "OpSwitch must be preceded by an OpSelectionMerge instruction");
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&target);
              goto LAB_0051822c;
            }
            local_4e4 = 1;
            while( true ) {
              uVar8 = (ulong)local_4e4;
              this = Instruction::operands((Instruction *)index);
              sVar9 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                                (this);
              if (sVar9 <= uVar8) break;
              local_4e8 = Instruction::GetOperandAs<unsigned_int>
                                    ((Instruction *)index,(ulong)local_4e4);
              std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&iter,&local_4e8);
              local_4e4 = local_4e4 + 2;
            }
          }
        }
      }
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::val::BasicBlock_*const_*,_std::vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_spvtools::val::BasicBlock_*const_*,_std::vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>_>_>
                  *)local_60);
  } while( true );
}

Assistant:

spv_result_t ValidateStructuredSelections(
    ValidationState_t& _, const std::vector<const BasicBlock*>& postorder) {
  std::unordered_set<uint32_t> seen;
  for (auto iter = postorder.rbegin(); iter != postorder.rend(); ++iter) {
    const auto* block = *iter;
    const auto* terminator = block->terminator();
    if (!terminator) continue;
    const auto index = terminator - &_.ordered_instructions()[0];
    auto* merge = &_.ordered_instructions()[index - 1];
    // Marks merges and continues as seen.
    if (merge->opcode() == spv::Op::OpSelectionMerge) {
      seen.insert(merge->GetOperandAs<uint32_t>(0));
    } else if (merge->opcode() == spv::Op::OpLoopMerge) {
      seen.insert(merge->GetOperandAs<uint32_t>(0));
      seen.insert(merge->GetOperandAs<uint32_t>(1));
    } else {
      // Only track the pointer if it is a merge instruction.
      merge = nullptr;
    }

    // Skip unreachable blocks.
    if (!block->structurally_reachable()) continue;

    if (terminator->opcode() == spv::Op::OpBranchConditional) {
      const auto true_label = terminator->GetOperandAs<uint32_t>(1);
      const auto false_label = terminator->GetOperandAs<uint32_t>(2);
      // Mark the upcoming blocks as seen now, but only error out if this block
      // was missing a merge instruction and both labels hadn't been seen
      // previously.
      const bool true_label_unseen = seen.insert(true_label).second;
      const bool false_label_unseen = seen.insert(false_label).second;
      if ((!merge || merge->opcode() == spv::Op::OpLoopMerge) &&
          true_label_unseen && false_label_unseen) {
        return _.diag(SPV_ERROR_INVALID_CFG, terminator)
               << "Selection must be structured";
      }
    } else if (terminator->opcode() == spv::Op::OpSwitch) {
      if (!merge) {
        return _.diag(SPV_ERROR_INVALID_CFG, terminator)
               << "OpSwitch must be preceded by an OpSelectionMerge "
                  "instruction";
      }
      // Mark the targets as seen.
      for (uint32_t i = 1; i < terminator->operands().size(); i += 2) {
        const auto target = terminator->GetOperandAs<uint32_t>(i);
        seen.insert(target);
      }
    }
  }

  return SPV_SUCCESS;
}